

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O0

nva_card * nva_init_platform(void)

{
  int iVar1;
  uint32_t pmc_id_00;
  DIR *__dirp;
  dirent *pdVar2;
  size_t sVar3;
  nva_card *__ptr;
  void *pvVar4;
  uint32_t pmc_id;
  char *last_four;
  int fd;
  DIR *dir;
  dirent *dent;
  nva_card *card;
  uint32_t bar0;
  uint32_t tmp;
  
  card._0_4_ = 0xffffffff;
  __dirp = opendir("/sys/bus/platform/devices");
  if (__dirp == (DIR *)0x0) {
    _bar0 = (nva_card *)0x0;
  }
  else {
    do {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) goto LAB_00102cc0;
      sVar3 = strlen(pdVar2->d_name);
      iVar1 = strcmp(pdVar2->d_name + (sVar3 - 4),".gpu");
    } while (((iVar1 != 0) ||
             (iVar1 = __isoc99_sscanf(pdVar2->d_name,"%x.gpu",(long)&card + 4), iVar1 != 1)) ||
            (iVar1 = check_modalias(pdVar2->d_name), iVar1 != 0));
    card._0_4_ = card._4_4_;
LAB_00102cc0:
    closedir(__dirp);
    if ((uint32_t)card == 0xffffffff) {
      _bar0 = (nva_card *)0x0;
    }
    else {
      __ptr = (nva_card *)calloc(0x90,1);
      if (__ptr == (nva_card *)0x0) {
        _bar0 = (nva_card *)0x0;
      }
      else {
        __ptr->type = NVA_DEVICE_GPU;
        __ptr->bus_type = NVA_BUS_PLATFORM;
        (__ptr->bus).platform_address = (uint32_t)card;
        iVar1 = open("/dev/mem",0x101002);
        if (iVar1 == -1) {
          fprintf(_stderr,"WARN: Can\'t open /dev/mem. Are you root?\n");
          free(__ptr);
          _bar0 = (nva_card *)0x0;
        }
        else {
          pvVar4 = mmap((void *)0x0,0x1000000,3,1,iVar1,(ulong)(uint32_t)card);
          __ptr->bar0 = pvVar4;
          if (__ptr->bar0 == (void *)0x0) {
            fprintf(_stderr,"WARN: Can\'t map the physical address 0x%x\n",(ulong)(uint32_t)card);
            free(__ptr);
            _bar0 = (nva_card *)0x0;
          }
          else {
            __ptr->bar0len = 0x1000000;
            pmc_id_00 = nva_grd32(__ptr->bar0,0);
            parse_pmc_id(pmc_id_00,&__ptr->chipset);
            _bar0 = __ptr;
            if ((__ptr->chipset).chipset == 0xea) {
              __ptr->hasbar1 = 1;
              __ptr->bar1len = 0x1000000;
              pvVar4 = mmap((void *)0x0,0x1000000,3,1,iVar1,0x58000000);
              __ptr->bar1 = pvVar4;
            }
          }
        }
      }
    }
  }
  return _bar0;
}

Assistant:

struct nva_card *nva_init_platform() {
	uint32_t tmp, bar0 = 0xffffffff;
	struct nva_card *card;
	struct dirent *dent;
	DIR *dir;
	int fd;

	/* Look for a gpu on the "platform" bus by looking at the platform bus,
	 * looking for an entry such as '/sys/bus/platform/devices/57000000.gpu'.
	 * We only expect up to one entry. This will not pick up the GPUs older
	 * than the tk1 because there was no "gpu" node before that, only gr2d
	 * and gr3d.
	 */
	if (!(dir = opendir(PLATFORM_DEVICES_DIR)))
		return NULL;
	while ((dent = readdir(dir))) {
		/* FIXME: this may not work on downstream kernels */
		const char *last_four = dent->d_name + strlen(dent->d_name) - 4;
		if (strcmp(last_four, ".gpu") == 0) {
			if (sscanf(dent->d_name, "%x.gpu", &tmp) == 1) {
				/* Check if the modalias contains nvidia */
				if (check_modalias(dent->d_name))
					continue;

				/* We have found the gpu, exit the loop */
				bar0 = tmp;
				break;
			}
		}
	}
	closedir(dir);

	if (bar0 == 0xffffffff)
		return NULL;

	/* we have found a gpu */
	card = calloc(sizeof *card, 1);
	if (!card)
                return 0;
	card->type = NVA_DEVICE_GPU;
	card->bus_type = NVA_BUS_PLATFORM;
	card->bus.platform_address = bar0;

	if((fd = open("/dev/mem", O_RDWR | O_SYNC)) == -1) {
		fprintf (stderr, "WARN: Can't open /dev/mem. Are you root?\n");
		free(card);
		return 0;
	}

	card->bar0 = mmap(0, 0x1000000, PROT_READ | PROT_WRITE, MAP_SHARED, fd, bar0);
	if (!card->bar0) {
		fprintf (stderr, "WARN: Can't map the physical address 0x%x\n", bar0);
		free(card);
		return 0;
	}
	card->bar0len = 0x1000000;

	uint32_t pmc_id = nva_grd32(card->bar0, 0);
	parse_pmc_id(pmc_id, &card->chipset);

	/* Enable bar1 for the devices we know because I cannot figure out how
	 * to read the relevant part of the DT via sysfs...
	 */
	if (card->chipset.chipset == 0xea) {
		card->hasbar1 = 1;
		card->bar1len = 0x1000000;
		card->bar1 = mmap(0, 0x1000000, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0x58000000);
	}

	return card;
}